

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapAsyncFunction(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  SnapGeneratorFunctionInfo *pSVar2;
  RecyclableObject *pRVar3;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)36>
                     (snpObject);
  pRVar3 = (RecyclableObject *)
           Js::JavascriptLibrary::CreateAsyncFunction
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                      Js::JavascriptAsyncFunction::EntryAsyncFunctionImplementation,
                      pSVar2->isAnonymousFunction);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapAsyncFunction(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapGeneratorFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapGeneratorFunctionInfo *, SnapObjectType::SnapAsyncFunction>(snpObject);
            Js::JavascriptAsyncFunction* func = ctx->GetLibrary()->CreateAsyncFunction(Js::JavascriptAsyncFunction::EntryAsyncFunctionImplementation, info->isAnonymousFunction);
            return func;
        }